

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.h
# Opt level: O0

bool spdlog::details::os::is_color_terminal(void)

{
  int iVar1;
  char **__first;
  char **__last;
  char *local_18;
  char *env_p;
  
  local_18 = getenv("TERM");
  if (local_18 == (char *)0x0) {
    env_p._7_1_ = false;
  }
  else {
    if (is_color_terminal()::result == '\0') {
      iVar1 = __cxa_guard_acquire(&is_color_terminal()::result);
      if (iVar1 != 0) {
        __first = std::begin<char_const*const,14ul>(&is_color_terminal::Terms);
        __last = std::end<char_const*const,14ul>(&is_color_terminal::Terms);
        is_color_terminal::result =
             std::
             any_of<char_const*const*,spdlog::details::os::is_color_terminal()::_lambda(char_const*)_1_>
                       (__first,__last,(anon_class_8_1_a7dcfcbe_for__M_pred)&local_18);
        __cxa_guard_release(&is_color_terminal()::result);
      }
    }
    env_p._7_1_ = (bool)(is_color_terminal::result & 1);
  }
  return env_p._7_1_;
}

Assistant:

inline bool is_color_terminal() SPDLOG_NOEXCEPT
{
#ifdef _WIN32
    return true;
#else
    static constexpr const char *Terms[] = {
        "ansi", "color", "console", "cygwin", "gnome", "konsole", "kterm", "linux", "msys", "putty", "rxvt", "screen", "vt100", "xterm"};

    const char *env_p = std::getenv("TERM");
    if (env_p == nullptr)
    {
        return false;
    }

    static const bool result =
        std::any_of(std::begin(Terms), std::end(Terms), [&](const char *term) { return std::strstr(env_p, term) != nullptr; });
    return result;
#endif
}